

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

int lws_mqtt_pconsume(lws_mqtt_parser_t *par,int consumed)

{
  lws_mqtt_packet_parse_state_t lVar1;
  uint uVar2;
  
  uVar2 = consumed + par->consumed;
  par->consumed = uVar2;
  if (par->props_len < uVar2) {
    return -1;
  }
  lVar1 = LMQCPP_PROP_ID_VBI;
  if (par->props_len <= uVar2) {
    uVar2 = (uint)(par->packet_type_flags >> 4);
    if (((0xf0f5U >> uVar2 & 1) != 0) ||
       (lVar1 = LMQCPP_PAYLOAD, (par->packet_type_flags & 6) == 0 && uVar2 == 3)) {
      lVar1 = LMQCPP_IDLE;
    }
  }
  par->state = lVar1;
  return 0;
}

Assistant:

static int
lws_mqtt_pconsume(lws_mqtt_parser_t *par, int consumed)
{
	par->consumed += consumed;

	if (par->consumed > par->props_len)
		return -1;

	/* more properties coming */

	if (par->consumed < par->props_len) {
		par->state = LMQCPP_PROP_ID_VBI;
		return 0;
	}

	/* properties finished: are we headed for payload or idle? */

	if ((map_flags[ctl_pkt_type(par)] & LMQCP_LUT_FLAG_PAYLOAD) &&
		/* A PUBLISH packet MUST NOT contain a Packet Identifier if
		 * its QoS value is set to 0 [MQTT-2.2.1-2]. */
	    (ctl_pkt_type(par) != LMQCP_PUBLISH ||
	     (par->packet_type_flags & 6))) {
		par->state = LMQCPP_PAYLOAD;
		return 0;
	}

	par->state = LMQCPP_IDLE;

	return 0;
}